

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_pages.c
# Opt level: O2

HPDF_REAL HPDF_Page_GetHorizontalScalling(HPDF_Page page)

{
  HPDF_BOOL HVar1;
  HPDF_REAL HVar2;
  
  HVar1 = HPDF_Page_Validate(page);
  if (HVar1 == 0) {
    HVar2 = 100.0;
  }
  else {
    HVar2 = *(HPDF_REAL *)(*(long *)((long)page->attr + 0x28) + 0x5c);
  }
  return HVar2;
}

Assistant:

HPDF_EXPORT(HPDF_REAL)
HPDF_Page_GetHorizontalScalling  (HPDF_Page   page)
{
    HPDF_PTRACE((" HPDF_Page_GetHorizontalScalling\n"));

    if (HPDF_Page_Validate (page)) {
        HPDF_PageAttr attr = (HPDF_PageAttr)page->attr;

        return attr->gstate->h_scalling;
    } else
        return HPDF_DEF_HSCALING;
}